

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest12InhibitAnyPolicy_::
Section12InvalidSelfIssuedinhibitAnyPolicyTest10<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section12InvalidSelfIssuedinhibitAnyPolicyTest10
          (Section12InvalidSelfIssuedinhibitAnyPolicyTest10<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  Section12InvalidSelfIssuedinhibitAnyPolicyTest10<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  ~Section12InvalidSelfIssuedinhibitAnyPolicyTest10(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest12InhibitAnyPolicy,
                     Section12InvalidSelfIssuedinhibitAnyPolicyTest10) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "inhibitAnyPolicy1CACert",
      "inhibitAnyPolicy1SelfIssuedCACert", "inhibitAnyPolicy1subCA2Cert",
      "InvalidSelfIssuedinhibitAnyPolicyTest10EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "inhibitAnyPolicy1CACRL",
                              "inhibitAnyPolicy1subCA2CRL"};
  PkitsTestInfo info;
  info.test_number = "4.12.10";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}